

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_node_short_edge
          (REF_GRID ref_grid,REF_INT node,REF_DBL *short_edge,REF_DBL *short_diag,REF_INT *short_id)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT geom;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_DBL diag;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  ref_geom = ref_grid->geom;
  *short_edge = 1.0;
  *short_diag = 1e+200;
  *short_id = -1;
  uVar4 = 0xffffffff;
  if (-1 < node) {
    uVar4 = 0xffffffff;
    if (node < ref_geom->ref_adj->nnode) {
      uVar4 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar4 == -1) {
    dVar7 = -1e+200;
    local_48 = 1e+200;
  }
  else {
    geom = ref_geom->ref_adj->item[(int)uVar4].ref;
    local_48 = 1e+200;
    uStack_40 = 0;
    dVar5 = -1e+200;
    do {
      dVar7 = dVar5;
      if (ref_geom->descr[geom * 6] == 1) {
        uVar3 = ref_egads_diagonal(ref_geom,geom,&local_50);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xa74,"ref_geom_node_short_edge",(ulong)uVar3,"edge diag");
          return uVar3;
        }
        if (local_50 < local_48) {
          *short_diag = local_50;
          *short_id = ref_geom->descr[(int)(geom * 6 | 1)];
          uStack_40 = 0;
          local_48 = local_50;
        }
        dVar7 = local_50;
        if (local_50 <= dVar5) {
          dVar7 = dVar5;
        }
      }
      pRVar2 = ref_geom->ref_adj->item;
      iVar1 = pRVar2[(int)uVar4].next;
      uVar4 = (ulong)iVar1;
      if (uVar4 == 0xffffffffffffffff) {
        geom = -1;
      }
      else {
        geom = pRVar2[uVar4].ref;
      }
      dVar5 = dVar7;
    } while (iVar1 != -1);
  }
  dVar5 = dVar7 * 1e+20;
  if (dVar5 <= -dVar5) {
    dVar5 = -dVar5;
  }
  dVar6 = local_48;
  if (local_48 <= -local_48) {
    dVar6 = -local_48;
  }
  if (dVar6 < dVar5) {
    *short_edge = local_48 / dVar7;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_short_edge(REF_GRID ref_grid,
                                                   REF_INT node,
                                                   REF_DBL *short_edge,
                                                   REF_DBL *short_diag,
                                                   REF_INT *short_id) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, geom;
  REF_DBL diag, min_diag, max_diag;
  *short_edge = 1.0;
  *short_diag = REF_DBL_MAX;
  *short_id = REF_EMPTY;
  min_diag = REF_DBL_MAX;
  max_diag = REF_DBL_MIN;
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_EDGE != ref_geom_type(ref_geom, geom)) continue;
    RSS(ref_egads_diagonal(ref_geom, geom, &diag), "edge diag");
    if (diag < min_diag) {
      min_diag = diag;
      *short_diag = diag;
      *short_id = ref_geom_id(ref_geom, geom);
    }
    max_diag = MAX(diag, max_diag);
  }
  if (ref_math_divisible(min_diag, max_diag)) {
    *short_edge = min_diag / max_diag;
  }
  return REF_SUCCESS;
}